

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyRigidBodyCollisionConfiguration.cpp
# Opt level: O0

btCollisionAlgorithmCreateFunc * __thiscall
btSoftBodyRigidBodyCollisionConfiguration::getCollisionAlgorithmCreateFunc
          (btSoftBodyRigidBodyCollisionConfiguration *this,int proxyType0,int proxyType1)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  btCollisionAlgorithmCreateFunc *local_8;
  
  if ((in_ESI == 0x20) && (in_EDX == 0x20)) {
    local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0xb8);
  }
  else if ((in_ESI == 0x20) && (bVar1 = btBroadphaseProxy::isConvex(in_EDX), bVar1)) {
    local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0xc0);
  }
  else {
    bVar1 = btBroadphaseProxy::isConvex(in_ESI);
    if ((bVar1) && (in_EDX == 0x20)) {
      local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 200);
    }
    else if ((in_ESI == 0x20) && (bVar1 = btBroadphaseProxy::isConcave(in_EDX), bVar1)) {
      local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0xd0);
    }
    else {
      bVar1 = btBroadphaseProxy::isConcave(in_ESI);
      if ((bVar1) && (in_EDX == 0x20)) {
        local_8 = *(btCollisionAlgorithmCreateFunc **)(in_RDI + 0xd8);
      }
      else {
        local_8 = btDefaultCollisionConfiguration::getCollisionAlgorithmCreateFunc
                            ((btDefaultCollisionConfiguration *)CONCAT44(in_ESI,in_EDX),
                             (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      }
    }
  }
  return local_8;
}

Assistant:

btCollisionAlgorithmCreateFunc* btSoftBodyRigidBodyCollisionConfiguration::getCollisionAlgorithmCreateFunc(int proxyType0,int proxyType1)
{

	///try to handle the softbody interactions first

	if ((proxyType0 == SOFTBODY_SHAPE_PROXYTYPE  ) && (proxyType1==SOFTBODY_SHAPE_PROXYTYPE))
	{
		return	m_softSoftCreateFunc;
	}

	///softbody versus convex
	if (proxyType0 == SOFTBODY_SHAPE_PROXYTYPE  && btBroadphaseProxy::isConvex(proxyType1))
	{
		return	m_softRigidConvexCreateFunc;
	}

	///convex versus soft body
	if (btBroadphaseProxy::isConvex(proxyType0) && proxyType1 == SOFTBODY_SHAPE_PROXYTYPE )
	{
		return	m_swappedSoftRigidConvexCreateFunc;
	}

#ifdef ENABLE_SOFTBODY_CONCAVE_COLLISIONS
	///softbody versus convex
	if (proxyType0 == SOFTBODY_SHAPE_PROXYTYPE  && btBroadphaseProxy::isConcave(proxyType1))
	{
		return	m_softRigidConcaveCreateFunc;
	}

	///convex versus soft body
	if (btBroadphaseProxy::isConcave(proxyType0) && proxyType1 == SOFTBODY_SHAPE_PROXYTYPE )
	{
		return	m_swappedSoftRigidConcaveCreateFunc;
	}
#endif

	///fallback to the regular rigid collision shape
	return btDefaultCollisionConfiguration::getCollisionAlgorithmCreateFunc(proxyType0,proxyType1);
}